

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O2

void __thiscall Am_Object_Data::Am_Object_Data(Am_Object_Data *this)

{
  uint *puVar1;
  Am_Demon_Set_Data *this_00;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002ea918;
  this->prototype = (Am_Object_Data *)0x0;
  this->first_instance = (Am_Object_Data *)0x0;
  this->next_instance = (Am_Object_Data *)0x0;
  this->first_part = (Am_Object_Data *)0x0;
  this->next_part = (Am_Object_Data *)0x0;
  Am_Demon_Queue::Am_Demon_Queue(&this->demon_queue);
  this->default_bits = 1;
  this->bits_mask = 0;
  Am_Slot_Data::Am_Slot_Data(&this->owner_slot,(Am_Object_Data *)0x0,10);
  Am_Slot_Data::Am_Slot_Data(&this->part_slot,(Am_Object_Data *)0x0,0);
  DynArray::DynArray(&this->data,8);
  (this->owner_slot).context = this;
  (this->owner_slot).super_Am_Value.value.wrapper_value = (Am_Wrapper *)0x0;
  (this->owner_slot).super_Am_Value.type = 0xa001;
  this->default_rule = Am_INHERIT;
  (this->part_slot).super_Am_Value.value.wrapper_value = &this->super_Am_Wrapper;
  (this->part_slot).super_Am_Value.type = 0xa001;
  this_00 = (Am_Demon_Set_Data *)operator_new(0xe8);
  Am_Demon_Set_Data::Am_Demon_Set_Data(this_00);
  this->demon_set = this_00;
  this->demons_active = 0x8000;
  puVar1 = &(this->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

Am_Object_Data::Am_Object_Data()
    : prototype(nullptr), first_instance(nullptr), next_instance(nullptr),
      first_part(nullptr), next_part(nullptr), default_bits(0x0001),
      bits_mask(0x0000), owner_slot(nullptr, Am_OWNER),
      part_slot(nullptr, Am_NO_SLOT), data(sizeof(Am_Slot_Data *))
{
#ifdef LEAK_TRACE
  std::cout << "ROOT\t\tcreated: " << this << "\tReferences: " << Ref_Count()
            << std::endl;
#endif
#ifdef DEBUG
  Am_Register_Name(this, append_number_to_name("ROOT"));
#endif
  owner_slot.context = this;
  owner_slot.value.wrapper_value = nullptr;
  owner_slot.type = Am_OBJECT;
  default_rule = Am_INHERIT;
  part_slot.value.wrapper_value = this;
  part_slot.type = Am_OBJECT;
  demon_set = new Am_Demon_Set_Data();
  demons_active = DEMONS_ACTIVE;

  // Prevents deallocation due to ref count.
  Note_Reference();
}